

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_FindObjectsInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount)

{
  SessionObjectStore *this_00;
  unsigned_long uVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  Session *this_01;
  Slot *this_02;
  CK_STATE CVar5;
  Token *this_03;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_04;
  CK_SLOT_ID CVar6;
  unsigned_long uVar7;
  ByteString *pBVar8;
  size_t sVar9;
  _Base_ptr p_Var10;
  size_t *outlen;
  CK_ULONG CVar11;
  char *in_R8;
  size_t *psVar12;
  size_t in_R9;
  CK_RV CVar13;
  unsigned_long *puVar14;
  bool bVar15;
  ByteString bsAttrValue;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> allObjects;
  ByteString bsTemplateValue;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> handles;
  OSAttribute attr;
  ByteString local_190;
  Session *local_168;
  CK_SESSION_HANDLE local_160;
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  local_158;
  ByteString local_128;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_100;
  OSAttribute local_d0;
  
  CVar13 = 400;
  if ((this->isInitialised == true) &&
     (CVar13 = 7, pTemplate != (CK_ATTRIBUTE_PTR)0x0 || ulCount == 0)) {
    this_01 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (this_01 == (Session *)0x0) {
      CVar13 = 0xb3;
    }
    else {
      this_02 = Session::getSlot(this_01);
      CVar13 = 5;
      if (this_02 != (Slot *)0x0) {
        CVar5 = Session::getState(this_01);
        this_03 = Session::getToken(this_01);
        if (this_03 != (Token *)0x0) {
          iVar4 = Session::getOpType(this_01);
          CVar13 = 0x90;
          if (iVar4 == 0) {
            Session::setOpType(this_01,1);
            this_04 = (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)FindOperation::create();
            if (this_04 ==
                (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)0x0) {
              CVar13 = 2;
            }
            else {
              local_158._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_158._M_impl.super__Rb_tree_header._M_header;
              local_158._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_158._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_158._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_168 = this_01;
              local_160 = hSession;
              local_158._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_158._M_impl.super__Rb_tree_header._M_header._M_left;
              Token::getObjects(this_03,(set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
                                         *)&local_158);
              this_00 = this->sessionObjectStore;
              CVar6 = Slot::getSlotID(this_02);
              SessionObjectStore::getObjects
                        (this_00,CVar6,
                         (set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                         &local_158);
              local_100._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_100._M_impl.super__Rb_tree_header._M_header;
              local_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              outlen = (size_t *)0x0;
              local_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_100._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_100._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_100._M_impl.super__Rb_tree_header._M_header._M_left;
              if ((_Rb_tree_header *)local_158._M_impl.super__Rb_tree_header._M_header._M_left !=
                  &local_158._M_impl.super__Rb_tree_header) {
                p_Var10 = local_158._M_impl.super__Rb_tree_header._M_header._M_left;
                do {
                  cVar2 = (**(code **)(**(long **)(p_Var10 + 1) + 0x50))();
                  if (cVar2 == '\0') {
                    outlen = (size_t *)0x7bf;
                    in_R8 = "Object is not valid, skipping";
                    softHSMLog(7,"C_FindObjectsInit",
                               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                               ,0x7bf,"Object is not valid, skipping");
                  }
                  else {
                    bVar3 = (**(code **)(**(long **)(p_Var10 + 1) + 0x20))
                                      (*(long **)(p_Var10 + 1),2,1);
                    bVar15 = (CVar5 - 1 & 0xfffffffffffffffd) != 0;
                    outlen = (size_t *)CONCAT71((int7)((ulong)outlen >> 8),bVar15);
                    if ((bVar15 & bVar3) == 0) {
                      CVar11 = ulCount;
                      puVar14 = &pTemplate->ulValueLen;
                      if (ulCount != 0) {
                        do {
                          cVar2 = (**(code **)(**(long **)(p_Var10 + 1) + 0x10))
                                            (*(long **)(p_Var10 + 1),
                                             ((_CK_ATTRIBUTE *)(puVar14 + -2))->type);
                          if (cVar2 == '\0') goto LAB_0012f5e6;
                          (**(code **)(**(long **)(p_Var10 + 1) + 0x18))
                                    (&local_d0,*(long **)(p_Var10 + 1),
                                     ((_CK_ATTRIBUTE *)(puVar14 + -2))->type);
                          bVar15 = OSAttribute::isBooleanAttribute(&local_d0);
                          if (!bVar15) {
                            bVar15 = OSAttribute::isUnsignedLongAttribute(&local_d0);
                            if (bVar15) {
                              if ((*puVar14 == 8) &&
                                 (uVar1 = *(unsigned_long *)puVar14[-1],
                                 uVar7 = OSAttribute::getUnsignedLongValue(&local_d0),
                                 uVar7 == uVar1)) goto LAB_0012f549;
                            }
                            else {
                              bVar15 = OSAttribute::isByteStringAttribute(&local_d0);
                              if (bVar15) {
                                ByteString::ByteString(&local_190);
                                if (bVar3 == 0) {
LAB_0012f4b9:
                                  pBVar8 = OSAttribute::getByteStringValue(&local_d0);
                                  ByteString::operator=(&local_190,pBVar8);
                                }
                                else {
                                  pBVar8 = OSAttribute::getByteStringValue(&local_d0);
                                  sVar9 = ByteString::size(pBVar8);
                                  if (sVar9 == 0) goto LAB_0012f4b9;
                                  pBVar8 = OSAttribute::getByteStringValue(&local_d0);
                                  iVar4 = Token::decrypt(this_03,(EVP_PKEY_CTX *)pBVar8,
                                                         (uchar *)&local_190,outlen,(uchar *)in_R8,
                                                         in_R9);
                                  if ((char)iVar4 == '\0') {
                                    std::
                                    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                    ::~_Rb_tree(this_04);
                                    operator_delete(this_04);
                                    local_190._vptr_ByteString =
                                         (_func_int **)&PTR__ByteString_0019d880;
                                    std::
                                    _Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                                    ~_Vector_base(&local_190.byteString.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                                 );
                                    OSAttribute::~OSAttribute(&local_d0);
                                    goto LAB_0012f702;
                                  }
                                }
                                sVar9 = ByteString::size(&local_190);
                                if (sVar9 == *puVar14) {
                                  if (sVar9 != 0) {
                                    ByteString::ByteString(&local_128,(uchar *)puVar14[-1],sVar9);
                                    bVar15 = ByteString::operator!=(&local_190,&local_128);
                                    local_128._vptr_ByteString =
                                         (_func_int **)&PTR__ByteString_0019d880;
                                    std::
                                    _Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                                    ~_Vector_base(&local_128.byteString.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                                 );
                                    if (bVar15) goto LAB_0012f631;
                                  }
                                  local_190._vptr_ByteString =
                                       (_func_int **)&PTR__ByteString_0019d880;
                                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                  ::~_Vector_base(&local_190.byteString.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                                 );
                                  goto LAB_0012f549;
                                }
LAB_0012f631:
                                local_190._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880
                                ;
                                std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::
                                ~_Vector_base(&local_190.byteString.
                                               super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
                                             );
                              }
                            }
LAB_0012f645:
                            OSAttribute::~OSAttribute(&local_d0);
                            goto LAB_0012f5e6;
                          }
                          if (*puVar14 != 1) goto LAB_0012f645;
                          cVar2 = *(char *)puVar14[-1];
                          bVar15 = OSAttribute::getBooleanValue(&local_d0);
                          outlen = (size_t *)CONCAT71((int7)((ulong)outlen >> 8),cVar2 != '\x01');
                          if (bVar15 == (cVar2 != '\x01')) goto LAB_0012f645;
LAB_0012f549:
                          OSAttribute::~OSAttribute(&local_d0);
                          puVar14 = puVar14 + 3;
                          CVar11 = CVar11 - 1;
                        } while (CVar11 != 0);
                      }
                      CVar6 = Slot::getSlotID(this_02);
                      cVar2 = (**(code **)(**(long **)(p_Var10 + 1) + 0x20))
                                        (*(long **)(p_Var10 + 1),1,0);
                      bVar15 = (bool)(**(code **)(**(long **)(p_Var10 + 1) + 0x20))
                                               (*(long **)(p_Var10 + 1),2,1);
                      in_R8 = *(char **)(p_Var10 + 1);
                      outlen = (size_t *)0x0;
                      if (cVar2 == '\0') {
                        local_d0._vptr_OSAttribute =
                             (_func_int **)
                             HandleManager::addSessionObject
                                       (this->handleManager,CVar6,local_160,bVar15,in_R8);
                      }
                      else {
                        psVar12 = (size_t *)in_R8;
                        local_d0._vptr_OSAttribute =
                             (_func_int **)
                             HandleManager::addTokenObject(this->handleManager,CVar6,bVar15,in_R8);
                        outlen = (size_t *)in_R8;
                        in_R8 = (char *)psVar12;
                      }
                      if (local_d0._vptr_OSAttribute == (_func_int **)0x0) {
                        std::
                        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::~_Rb_tree(this_04);
                        operator_delete(this_04);
LAB_0012f702:
                        CVar13 = 5;
                        goto LAB_0012f694;
                      }
                      std::
                      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      ::_M_insert_unique<unsigned_long_const&>
                                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                  *)&local_100,(unsigned_long *)&local_d0);
                    }
                  }
LAB_0012f5e6:
                  p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
                } while ((_Rb_tree_header *)p_Var10 != &local_158._M_impl.super__Rb_tree_header);
              }
              FindOperation::setHandles
                        ((FindOperation *)this_04,
                         (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)&local_100);
              Session::setFindOp(local_168,(FindOperation *)this_04);
              CVar13 = 0;
LAB_0012f694:
              std::
              _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
              ::~_Rb_tree(&local_100);
              std::
              _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
              ::~_Rb_tree(&local_158);
            }
          }
        }
      }
    }
  }
  return CVar13;
}

Assistant:

CK_RV SoftHSM::C_FindObjectsInit(CK_SESSION_HANDLE hSession, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;
	if (pTemplate == NULL_PTR && ulCount != 0) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the slot
	Slot* slot = session->getSlot();
	if (slot == NULL_PTR) return CKR_GENERAL_ERROR;

	// Determine whether we have a public session or not.
	bool isPublicSession;
	switch (session->getState()) {
		case CKS_RO_USER_FUNCTIONS:
		case CKS_RW_USER_FUNCTIONS:
			isPublicSession = false;
			break;
		default:
			isPublicSession = true;
	}

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	session->setOpType(SESSION_OP_FIND);
	FindOperation *findOp = FindOperation::create();

	// Check if we are out of memory
	if (findOp == NULL_PTR) return CKR_HOST_MEMORY;

	std::set<OSObject*> allObjects;
	token->getObjects(allObjects);
	sessionObjectStore->getObjects(slot->getSlotID(),allObjects);

	std::set<CK_OBJECT_HANDLE> handles;
	std::set<OSObject*>::iterator it;
	for (it=allObjects.begin(); it != allObjects.end(); ++it)
	{
		// Refresh object and check if it is valid
		if (!(*it)->isValid()) {
			DEBUG_MSG("Object is not valid, skipping");
			continue;
		}

		// Determine if the object has CKA_PRIVATE set to CK_TRUE
		bool isPrivateObject = (*it)->getBooleanValue(CKA_PRIVATE, true);

		// If the object is private, and we are in a public session then skip it !
		if (isPublicSession && isPrivateObject)
			continue; // skip object

		// Perform the actual attribute matching.
		bool bAttrMatch = true; // We let an empty template match everything.
		for (CK_ULONG i=0; i<ulCount; ++i)
		{
			bAttrMatch = false;

			if (!(*it)->attributeExists(pTemplate[i].type))
				break;

			OSAttribute attr = (*it)->getAttribute(pTemplate[i].type);

			if (attr.isBooleanAttribute())
			{
				if (sizeof(CK_BBOOL) != pTemplate[i].ulValueLen)
					break;
				bool bTemplateValue = (*(CK_BBOOL*)pTemplate[i].pValue == CK_TRUE);
				if (attr.getBooleanValue() != bTemplateValue)
					break;
			}
			else
			{
				if (attr.isUnsignedLongAttribute())
				{
					if (sizeof(CK_ULONG) != pTemplate[i].ulValueLen)
						break;
					CK_ULONG ulTemplateValue = *(CK_ULONG_PTR)pTemplate[i].pValue;
					if (attr.getUnsignedLongValue() != ulTemplateValue)
						break;
				}
				else
				{
					if (attr.isByteStringAttribute())
					{
						ByteString bsAttrValue;
						if (isPrivateObject && attr.getByteStringValue().size() != 0)
						{
							if (!token->decrypt(attr.getByteStringValue(), bsAttrValue))
							{
								delete findOp;
								return CKR_GENERAL_ERROR;
							}
						}
						else
							bsAttrValue = attr.getByteStringValue();

						if (bsAttrValue.size() != pTemplate[i].ulValueLen)
							break;
						if (pTemplate[i].ulValueLen != 0)
						{
							ByteString bsTemplateValue((const unsigned char*)pTemplate[i].pValue, pTemplate[i].ulValueLen);
							if (bsAttrValue != bsTemplateValue)
								break;
						}
					}
					else
						break;
				}
			}
			// The attribute matched !
			bAttrMatch = true;
		}

		if (bAttrMatch)
		{
			CK_SLOT_ID slotID = slot->getSlotID();
			bool isOnToken = (*it)->getBooleanValue(CKA_TOKEN, false);
			bool isPrivate = (*it)->getBooleanValue(CKA_PRIVATE, true);
			// Create an object handle for every returned object.
			CK_OBJECT_HANDLE hObject;
			if (isOnToken)
				hObject = handleManager->addTokenObject(slotID,isPrivate,*it);
			else
				hObject = handleManager->addSessionObject(slotID,hSession,isPrivate,*it);
			if (hObject == CK_INVALID_HANDLE)
			{
				delete findOp;
				return CKR_GENERAL_ERROR;
			}
			handles.insert(hObject);
		}
	}

	// Storing the object handles for the find will protect the library
	// whenever a stale object handle is used to access the library.
	findOp->setHandles(handles);

	session->setFindOp(findOp);

	return CKR_OK;
}